

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

wstring * __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_exit_wide
          (wstring *__return_storage_ptr__,
          NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wstring *prefix)

{
  wstring local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  
  std::operator+(&local_30,prefix,L"_S");
  std::__cxx11::to_wstring
            (&local_50,
             ((long)(this->m_states).
                    super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_states).
                   super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28 - 1);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_exit_wide(const std::wstring& prefix) const
	{
		return prefix + L"_S" + std::to_wstring(m_states.size() - 1);
	}